

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QShaderDescription::PushConstantBlock>::resize_internal
          (QList<QShaderDescription::PushConstantBlock> *this,qsizetype newSize)

{
  Data *pDVar1;
  long lVar2;
  qsizetype qVar3;
  __off_t __length;
  
  pDVar1 = (this->d).d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    lVar2 = (pDVar1->super_QArrayData).alloc;
    qVar3 = QArrayDataPointer<QShaderDescription::PushConstantBlock>::freeSpaceAtBegin(&this->d);
    if (newSize <= lVar2 - qVar3) {
      if (newSize < (this->d).size) {
        QtPrivate::QGenericArrayOps<QShaderDescription::PushConstantBlock>::truncate
                  ((QGenericArrayOps<QShaderDescription::PushConstantBlock> *)this,(char *)newSize,
                   __length);
        return;
      }
      return;
    }
  }
  QArrayDataPointer<QShaderDescription::PushConstantBlock>::detachAndGrow
            (&this->d,GrowsAtEnd,newSize - (this->d).size,(PushConstantBlock **)0x0,
             (QArrayDataPointer<QShaderDescription::PushConstantBlock> *)0x0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}